

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  code *pcVar1;
  undefined8 uVar2;
  thread *ptVar3;
  uint uVar4;
  thread *t;
  thread *this;
  char *pcVar5;
  char___0_ *__range1_1;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uStack_1a0;
  undefined1 local_198 [8];
  Database tpch;
  char **argv_local;
  undefined1 *local_60;
  thread local_58;
  thread *local_50;
  thread (*__range1) [27942];
  ulong uStack_40;
  int round;
  uint local_38;
  uint local_34;
  int thread_num;
  
  uStack_1a0 = 0x1033bd;
  tpch._264_8_ = argv;
  mkdir(DATA_PATH_abi_cxx11_._M_dataplus._M_p,0x1ff);
  tpch.a_lineitemposition[4]._0_1_ = 0;
  uStack_1a0 = 0x1033dc;
  Database::importDB((Database *)local_198,argv[1],argv[2],argv[3]);
  uStack_1a0 = 0x1033ed;
  std::__cxx11::string::string((string *)&argv_local,argv[4],(allocator *)&local_58);
  uStack_1a0 = 0x1033fb;
  uVar4 = std::__cxx11::stoi((string *)&argv_local,(size_t *)0x0,10);
  uStack_1a0 = 0x103407;
  std::__cxx11::string::~string((string *)&argv_local);
  local_60 = local_198;
  uStack_1a0 = 0x10;
  uVar7 = 0x10;
  if ((int)uVar4 < 0x10) {
    uVar7 = (ulong)uVar4;
  }
  __range1._4_4_ = uVar4;
  local_38 = (uint)uVar7;
  lVar8 = -(uVar7 * 8 + 0xf & 0xfffffffffffffff0);
  this = (thread *)(local_198 + lVar8);
  if (uVar4 != 0) {
    *(undefined8 *)(local_198 + lVar8 + -8) = 0x10344b;
    memset(this,0,uVar7 * 8);
  }
  local_34 = uVar4;
  pcVar5 = (char *)(ulong)uVar4;
  pcVar6 = (char *)((long)this - ((long)pcVar5 * 8 + 0xfU & 0xfffffffffffffff0));
  local_50 = this;
  uStack_40 = uVar7;
  for (lVar8 = 0; ptVar3 = local_50, lVar8 < (int)uVar7; lVar8 = lVar8 + 1) {
    local_58._M_id._M_thread = (id)0;
    pcVar6[-8] = '@';
    pcVar6[-7] = '\0';
    pcVar6[-6] = '\0';
    pcVar6[-5] = '\0';
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    uVar7 = *(ulong *)(pcVar6 + -8);
    pcVar6[-8] = -0x6c;
    pcVar6[-7] = '4';
    pcVar6[-6] = '\x10';
    pcVar6[-5] = '\0';
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    argv_local = (char **)operator_new(uVar7);
    *argv_local = (char *)&PTR___State_00107d40;
    *(int *)(argv_local + 1) = (int)lVar8;
    argv_local[2] = (char *)((long)&__range1 + 4);
    argv_local[3] = (char *)&local_38;
    argv_local[4] = (char *)&tpch.pending;
    argv_local[5] = pcVar5;
    argv_local[6] = pcVar6;
    argv_local[7] = local_198;
    pcVar6[-8] = -0x21;
    pcVar6[-7] = '4';
    pcVar6[-6] = '\x10';
    pcVar6[-5] = '\0';
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    std::thread::_M_start_thread(&local_58,&argv_local,0);
    if (argv_local != (char **)0x0) {
      pcVar1 = *(code **)(*argv_local + 8);
      pcVar6[-8] = -0x12;
      pcVar6[-7] = '4';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      (*pcVar1)();
    }
    pcVar6[-8] = -7;
    pcVar6[-7] = '4';
    pcVar6[-6] = '\x10';
    pcVar6[-5] = '\0';
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    std::thread::operator=(this,&local_58);
    builtin_strncpy(pcVar6 + -8,"\x015\x10",4);
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    std::thread::~thread(&local_58);
    uVar7 = (ulong)local_38;
    this = this + 1;
  }
  for (lVar8 = uStack_40 * 8; lVar8 != 0; lVar8 = lVar8 + -8) {
    builtin_strncpy(pcVar6 + -8,"05\x10",4);
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    std::thread::join();
  }
  for (lVar8 = 0; (long)pcVar5 << 3 != lVar8; lVar8 = lVar8 + 8) {
    uVar2 = *(undefined8 *)(pcVar6 + lVar8);
    builtin_strncpy(pcVar6 + -8,"[5\x10",4);
    pcVar6[-4] = '\0';
    pcVar6[-3] = '\0';
    pcVar6[-2] = '\0';
    pcVar6[-1] = '\0';
    printf("%s",uVar2);
  }
  if (local_34 != 0) {
    lVar8 = uStack_40 * 8;
    do {
      pcVar6[-8] = -0x80;
      pcVar6[-7] = '5';
      pcVar6[-6] = '\x10';
      pcVar6[-5] = '\0';
      pcVar6[-4] = '\0';
      pcVar6[-3] = '\0';
      pcVar6[-2] = '\0';
      pcVar6[-1] = '\0';
      std::thread::~thread((thread *)((long)&ptVar3[-1]._M_id._M_thread + lVar8));
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  *(undefined8 *)(local_60 + -8) = 0x103596;
  Database::~Database((Database *)local_198);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  mkdir(DATA_PATH.c_str(), 0777);

  Database tpch;

  // load
  tpch.importDB(argv[1], argv[2], argv[3]);

  auto round = std::stoi(argv[4]);
  auto thread_num = std::min(MAX_CORE_NUM, round);
  std::thread threads[thread_num];
  char* results[round];

  // query
  for (int i = 0; i < thread_num; i++) {
    threads[i] = std::thread([&, i]{
      for (int round_id = i; round_id < round; round_id += thread_num) {
        auto mktsegmentCondition = argv[5 + round_id * 4][0];
        auto orderdateCondition = util::DateToInt(argv[5 + round_id * 4 + 1]);
        auto shipdateCondition = util::DateToInt(argv[5 + round_id * 4 + 2]);
        auto topn = std::stoi(argv[5 + round_id * 4 + 3]);
        results[round_id] = tpch.query(mktsegmentCondition, orderdateCondition, shipdateCondition, topn);
      }
    });
  }

  for (auto &t : threads) {
    t.join();
  }

  for (auto &r : results) {
    printf("%s", r);
  }

  return 0;
}